

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

string * testing::internal::FormatMatcherDescription
                   (string *__return_storage_ptr__,char *matcher_name,char *description,
                   Interpolations *interp,Strings *param_values)

{
  int iVar1;
  pointer pIVar2;
  ulong uVar3;
  long lVar4;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*description == '\0') {
    ConvertIdentifierNameToWords_abi_cxx11_(&local_70,(internal *)matcher_name,description);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if ((param_values->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (param_values->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      JoinAsTuple(&local_50,param_values);
      std::operator+(&local_70," ",&local_50);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  else {
    pIVar2 = (interp->
             super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    for (uVar3 = 0;
        uVar3 < (ulong)(((long)(interp->
                               super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) / 0x18);
        uVar3 = uVar3 + 1) {
      std::__cxx11::string::append<char_const*,void>
                ((string *)__return_storage_ptr__,description,
                 *(char **)((long)&pIVar2->start_pos + lVar4));
      iVar1 = *(int *)((long)&((interp->
                               super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                               )._M_impl.super__Vector_impl_data._M_start)->param_index + lVar4);
      if (iVar1 != -3) {
        if (iVar1 == -2) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        else if (iVar1 == -1) {
          JoinAsTuple(&local_70,param_values);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_70);
        }
        else {
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
      }
      pIVar2 = (interp->
               super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
               )._M_impl.super__Vector_impl_data._M_start;
      description = *(char **)((long)&pIVar2->end_pos + lVar4);
      lVar4 = lVar4 + 0x18;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatMatcherDescription(
    const char* matcher_name, const char* description,
    const Interpolations& interp, const Strings& param_values) {
  string result;
  if (*description == '\0') {
    // When the user supplies an empty description, we calculate one
    // from the matcher name.
    result = ConvertIdentifierNameToWords(matcher_name);
    if (param_values.size() >= 1)
      result += " " + JoinAsTuple(param_values);
  } else {
    // The end position of the last interpolation.
    const char* last_interp_end = description;
    for (size_t i = 0; i < interp.size(); i++) {
      result.append(last_interp_end, interp[i].start_pos);
      const int param_index = interp[i].param_index;
      if (param_index == kTupleInterpolation) {
        result += JoinAsTuple(param_values);
      } else if (param_index == kPercentInterpolation) {
        result += '%';
      } else if (param_index != kInvalidInterpolation) {
        result += param_values[param_index];
      }
      last_interp_end = interp[i].end_pos;
    }
    result += last_interp_end;
  }

  return result;
}